

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O0

void __thiscall
cnn::Conv1DWide::backward_impl
          (Conv1DWide *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  const_reference ppTVar5;
  Scalar *pSVar6;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  uint in_R8D;
  uint k_1;
  float xij;
  uint j_1;
  uint i_2;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  uint k;
  uint j;
  uint i_1;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> f;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> di;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> d;
  uint fcols;
  uint xcols;
  uint rows;
  uint in_stack_ffffffffffffff20;
  Scalar in_stack_ffffffffffffff24;
  float fVar7;
  undefined4 in_stack_ffffffffffffff28;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff2c;
  uint uVar9;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *in_stack_ffffffffffffff30;
  Tensor *in_stack_ffffffffffffff38;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  
  if (1 < in_R8D) {
    __assert_fail("i < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                  ,0xe9,
                  "virtual void cnn::Conv1DWide::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  ppTVar5 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,0);
  uVar2 = Dim::rows(&(*ppTVar5)->d);
  ppTVar5 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,0);
  uVar3 = Dim::cols(&(*ppTVar5)->d);
  ppTVar5 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,1);
  uVar4 = Dim::cols(&(*ppTVar5)->d);
  Tensor::operator*(in_stack_ffffffffffffff38);
  Tensor::operator*(in_stack_ffffffffffffff38);
  if (in_R8D == 0) {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,1);
    Tensor::operator*(in_stack_ffffffffffffff38);
    for (local_a4 = 0; local_a4 < uVar2; local_a4 = local_a4 + 1) {
      for (local_a8 = 0; local_a8 < uVar3; local_a8 = local_a8 + 1) {
        for (local_ac = 0; local_ac < uVar4; local_ac = local_ac + 1) {
          pSVar6 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()(in_stack_ffffffffffffff30,
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          fVar1 = *pSVar6;
          pSVar6 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()(in_stack_ffffffffffffff30,
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          fVar7 = *pSVar6;
          pSVar6 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()(in_stack_ffffffffffffff30,
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          *pSVar6 = fVar1 * fVar7 + *pSVar6;
        }
      }
    }
  }
  else {
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
    Tensor::operator*(in_stack_ffffffffffffff38);
    for (uVar9 = 0; uVar9 < uVar2; uVar9 = uVar9 + 1) {
      for (uVar8 = 0; uVar8 < uVar3; uVar8 = uVar8 + 1) {
        pSVar6 = Eigen::
                 DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 ::operator()(in_stack_ffffffffffffff30,CONCAT44(uVar9,uVar8),
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        in_stack_ffffffffffffff24 = *pSVar6;
        for (in_stack_ffffffffffffff20 = 0; in_stack_ffffffffffffff20 < uVar4;
            in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 + 1) {
          fVar7 = in_stack_ffffffffffffff24;
          pSVar6 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()(in_stack_ffffffffffffff30,CONCAT44(uVar9,uVar8),
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          fVar1 = *pSVar6;
          pSVar6 = Eigen::
                   DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   ::operator()(in_stack_ffffffffffffff30,CONCAT44(uVar9,uVar8),
                                CONCAT44(fVar7,in_stack_ffffffffffffff20));
          *pSVar6 = in_stack_ffffffffffffff24 * fVar1 + *pSVar6;
          in_stack_ffffffffffffff24 = fVar7;
        }
      }
    }
  }
  return;
}

Assistant:

void Conv1DWide::backward_impl(const vector<const Tensor*>& xs,
                          const Tensor& fx,
                          const Tensor& dEdf,
                          unsigned i,
                          Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Conv1DWide::backward not implemented for CUDA");
#else
  assert(i < 2);
  const unsigned rows = xs[0]->d.rows();
  const unsigned xcols = xs[0]->d.cols();
  const unsigned fcols = xs[1]->d.cols();
  auto d = *dEdf;
  auto di = *dEdxi;
  if (i == 0) { // derivative wrt input x
    auto f = **xs[1];
    for (unsigned i = 0; i < rows; ++i) {
      for (unsigned j = 0; j < xcols; ++j) {
        for (unsigned k = 0; k < fcols; ++k)
          di(i, j) += f(i, k) * d(i, j + k);
      }
    }
  } else { // derivative wrt filter f
    auto x = **xs[0];
    for (unsigned i = 0; i < rows; ++i) {
      for (unsigned j = 0; j < xcols; ++j) {
        const float xij = x(i, j);
        for (unsigned k = 0; k < fcols; ++k)
          di(i, k) += xij * d(i, j + k);
      }
    }
  }
#endif
}